

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ParameterValueAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterValueAssignmentSyntax,slang::parsing::Token&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_2,Token *args_3)

{
  Token hash;
  Token openParen;
  Token closeParen;
  ParameterValueAssignmentSyntax *this_00;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> local_60;
  
  this_00 = (ParameterValueAssignmentSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ParameterValueAssignmentSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ParameterValueAssignmentSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  hash.kind = args->kind;
  hash._2_1_ = args->field_0x2;
  hash.numFlags.raw = (args->numFlags).raw;
  hash.rawLen = args->rawLen;
  hash.info = args->info;
  openParen.kind = args_1->kind;
  openParen._2_1_ = args_1->field_0x2;
  openParen.numFlags.raw = (args_1->numFlags).raw;
  openParen.rawLen = args_1->rawLen;
  openParen.info = args_1->info;
  local_60.elements._M_ptr = args_2->_M_ptr;
  local_60.super_SyntaxListBase.childCount = (args_2->_M_extent)._M_extent_value;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006d1508;
  closeParen.kind = args_3->kind;
  closeParen._2_1_ = args_3->field_0x2;
  closeParen.numFlags.raw = (args_3->numFlags).raw;
  closeParen.rawLen = args_3->rawLen;
  closeParen.info = args_3->info;
  local_60.elements._M_extent._M_extent_value = local_60.super_SyntaxListBase.childCount;
  slang::syntax::ParameterValueAssignmentSyntax::ParameterValueAssignmentSyntax
            (this_00,hash,openParen,&local_60,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }